

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O0

adjusted_mantissa
fast_float::digit_comp<float,char>(parsed_number_string_t<char> *num,adjusted_mantissa am)

{
  uint uVar1;
  size_t max_digits_00;
  int32_t exponent_00;
  int32_t in_R8D;
  adjusted_mantissa aVar2;
  adjusted_mantissa aVar3;
  undefined1 local_258 [4];
  int32_t exponent;
  bigint bigmant;
  size_t digits;
  size_t max_digits;
  int32_t sci_exp;
  parsed_number_string_t<char> *num_local;
  adjusted_mantissa am_local;
  int32_t local_28;
  int local_1c;
  uint64_t uStack_18;
  int32_t exponent_1;
  uint64_t mantissa;
  
  local_1c = (int)num->exponent;
  for (uStack_18 = num->mantissa; 9999 < uStack_18; uStack_18 = uStack_18 / 10000) {
    local_1c = local_1c + 4;
  }
  for (; 99 < uStack_18; uStack_18 = uStack_18 / 100) {
    local_1c = local_1c + 2;
  }
  for (; 9 < uStack_18; uStack_18 = uStack_18 / 10) {
    local_1c = local_1c + 1;
  }
  max_digits_00 = binary_format<float>::max_digits();
  bigmant.vec.length = 0;
  bigmant.vec._498_6_ = 0;
  bigint::bigint((bigint *)local_258);
  parse_mantissa<char>((bigint *)local_258,num,max_digits_00,(size_t *)&bigmant.vec.length);
  uVar1 = (local_1c + 1) - bigmant.vec._496_4_;
  if ((int)uVar1 < 0) {
    aVar2.power2 = uVar1;
    aVar2.mantissa = (ulong)(am.power2 + 0x8000);
    aVar2._12_4_ = 0;
    aVar2 = negative_digit_comp<float>((fast_float *)local_258,(bigint *)am.mantissa,aVar2,in_R8D);
    am_local._8_8_ = aVar2.mantissa;
    local_28 = aVar2.power2;
  }
  else {
    aVar2 = positive_digit_comp<float>((fast_float *)local_258,(bigint *)(ulong)uVar1,exponent_00);
    am_local._8_8_ = aVar2.mantissa;
    local_28 = aVar2.power2;
  }
  aVar3.power2 = local_28;
  aVar3.mantissa = am_local._8_8_;
  aVar3._12_4_ = 0;
  return aVar3;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa digit_comp(parsed_number_string_t<UC>& num, adjusted_mantissa am) noexcept {
  // remove the invalid exponent bias
  am.power2 -= invalid_am_bias;

  int32_t sci_exp = scientific_exponent(num);
  size_t max_digits = binary_format<T>::max_digits();
  size_t digits = 0;
  bigint bigmant;
  parse_mantissa(bigmant, num, max_digits, digits);
  // can't underflow, since digits is at most max_digits.
  int32_t exponent = sci_exp + 1 - int32_t(digits);
  if (exponent >= 0) {
    return positive_digit_comp<T>(bigmant, exponent);
  } else {
    return negative_digit_comp<T>(bigmant, am, exponent);
  }
}